

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_filter_lzop.c
# Opt level: O1

void test_read_filter_lzop(void)

{
  int iVar1;
  wchar_t wVar2;
  archive_conflict *a;
  char *v2;
  char *pcVar3;
  ulong uVar4;
  undefined **ppuVar5;
  archive_entry *ae;
  archive_entry *local_38;
  
  extract_reference_file("test_read_filter_lzop.tar.lzo");
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_lzop.c"
                   ,L'\'',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_lzop((archive *)a);
  if (iVar1 != 0) {
    wVar2 = canLzop();
    if (wVar2 == L'\0') {
      iVar1 = archive_read_free((archive *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_lzop.c"
                          ,L'+',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_lzop.c"
                     ,L',');
      test_skipping("lzop compression is not supported on this platform");
      return;
    }
    if (iVar1 != -0x14) {
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_lzop.c"
                          ,L'0',0,"ARCHIVE_OK",(long)iVar1,"r",a);
      iVar1 = archive_read_free((archive *)a);
      wVar2 = L'1';
      goto LAB_0015798a;
    }
  }
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_lzop.c"
                      ,L'5',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  wVar2 = archive_read_open_filename(a,"test_read_filter_lzop.tar.lzo",0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_lzop.c"
                      ,L'7',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, reference, 10240)",a);
  ppuVar5 = &PTR_anon_var_dwarf_5ae19_00305f80;
  uVar4 = 0;
  do {
    pcVar3 = *ppuVar5;
    failure("Could not read file %d (%s) from %s",uVar4 & 0xffffffff,pcVar3,
            "test_read_filter_lzop.tar.lzo");
    iVar1 = archive_read_next_header((archive *)a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_lzop.c"
                        ,L'>',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    v2 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_lzop.c"
               ,L'?',pcVar3,"n[i]",v2,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    uVar4 = uVar4 + 1;
    ppuVar5 = ppuVar5 + 1;
  } while (uVar4 != 7);
  iVar1 = archive_read_next_header((archive *)a,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_lzop.c"
                      ,L'C',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  iVar1 = archive_filter_count((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_lzop.c"
                      ,L'F',(long)iVar1,"archive_filter_count(a)",2,"2",(void *)0x0);
  iVar1 = archive_filter_code((archive *)a,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_lzop.c"
                      ,L'G',(long)iVar1,"archive_filter_code(a, 0)",0xb,"ARCHIVE_FILTER_LZOP",
                      (void *)0x0);
  pcVar3 = archive_filter_name((archive *)a,0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_lzop.c"
             ,L'H',pcVar3,"archive_filter_name(a, 0)","lzop","\"lzop\"",(void *)0x0,L'\0');
  iVar1 = archive_format((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_lzop.c"
                      ,L'I',(long)iVar1,"archive_format(a)",0x30001,"ARCHIVE_FORMAT_TAR_USTAR",
                      (void *)0x0);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_lzop.c"
                      ,L'K',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free((archive *)a);
  wVar2 = L'L';
LAB_0015798a:
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_lzop.c"
                      ,wVar2,0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_filter_lzop)
{
	const char *reference = "test_read_filter_lzop.tar.lzo";
	/* lrzip tracks directories as files, ensure that we list everything */
	const char *n[] = {
		"d1/", "d1/f2", "d1/f3", "d1/f1", "f1", "f2", "f3", NULL };
	struct archive_entry *ae;
	struct archive *a;
	int i, r;

	extract_reference_file(reference);
	assert((a = archive_read_new()) != NULL);
	r = archive_read_support_filter_lzop(a);
	if (r != ARCHIVE_OK) {
		if (!canLzop()) {
			assertEqualInt(ARCHIVE_OK, archive_read_free(a));
			skipping("lzop compression is not supported "
			    "on this platform");
			return;
		} else if (r != ARCHIVE_WARN) {
			assertEqualIntA(a, ARCHIVE_OK, r);
			assertEqualInt(ARCHIVE_OK, archive_read_free(a));
			return;
		}
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
		archive_read_open_filename(a, reference, 10240));

	/* Read entries, match up names with list above. */
	for (i = 0; n[i] != NULL; ++i) {
		failure("Could not read file %d (%s) from %s",
			i, n[i], reference);
		assertEqualIntA(a, ARCHIVE_OK,
			archive_read_next_header(a, &ae));
		assertEqualString(n[i], archive_entry_pathname(ae));
	}

	/* Verify the end-of-archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify that the format detection worked. */
	assertEqualInt(archive_filter_count(a), 2);
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_LZOP);
	assertEqualString(archive_filter_name(a, 0), "lzop");
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_USTAR);

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}